

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall HFactor::updateFT(HFactor *this,HVector *aq,HVector *ep,int iRow,int *hint)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  int iVar6;
  HFactor *pHVar7;
  HVector *pHVar8;
  int iVar9;
  int iVar10;
  pointer piVar11;
  pointer piVar12;
  int iVar13;
  size_t sVar14;
  pointer piVar15;
  vector<int,_std::allocator<int>_> *pvVar16;
  vector<int,_std::allocator<int>_> *pvVar17;
  long lVar18;
  int i;
  long lVar19;
  size_type __new_size;
  HFactor *pHVar20;
  int i_1;
  long lVar21;
  int local_d4;
  HFactor *local_d0;
  long local_c8;
  double local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  vector<int,_std::allocator<int>_> *local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  pointer local_98;
  vector<double,_std::allocator<double>_> *local_90;
  vector<int,_std::allocator<int>_> *local_88;
  vector<int,_std::allocator<int>_> *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  double local_70;
  vector<double,_std::allocator<double>_> *local_68;
  vector<int,_std::allocator<int>_> *local_60;
  long local_58;
  double local_50;
  vector<double,_std::allocator<double>_> *local_48;
  HVector *local_40;
  long local_38;
  
  local_58 = (long)iRow;
  piVar15 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_c8 = (long)piVar15[local_58];
  local_48 = &this->UpivotValue;
  local_70 = (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[local_c8];
  local_50 = (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[local_58];
  local_60 = &this->UpivotIndex;
  (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[local_c8] = -1;
  piVar11 = (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_98 = (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_78 = &this->URlastp;
  this->FtotalX = this->FtotalX + (local_98[local_c8] - piVar11[local_c8]);
  local_80 = &this->URstart;
  lVar18 = (long)local_98[local_c8];
  local_b0 = &this->URindex;
  piVar12 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_a8 = &this->Ustart;
  piVar2 = (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_a0 = &this->Ulastp;
  local_b8 = &this->Uindex;
  piVar4 = (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68 = &this->Uvalue;
  pdVar5 = (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (piVar11[local_c8] <= lVar18) {
      this->FtotalX = this->FtotalX + (piVar2[local_c8] - piVar3[local_c8]);
      lVar18 = (long)piVar2[local_c8];
      piVar12 = (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar2 = (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_88 = &this->URspace;
      piVar4 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_90 = &this->URvalue;
      pdVar5 = (this->URvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (piVar3[local_c8] <= lVar18) {
          local_c0 = (double)CONCAT44(local_c0._4_4_,
                                      (int)((ulong)((long)(this->Uindex).
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)piVar12) >> 2));
          local_d4 = iRow;
          local_d0 = this;
          local_40 = ep;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_a8,(int *)&local_c0);
          lVar18 = 0;
          lVar21 = 0;
          for (lVar19 = 0; pHVar20 = local_d0, lVar19 < aq->packCount; lVar19 = lVar19 + 1) {
            piVar15 = (aq->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (*(int *)((long)piVar15 + lVar21) != iRow) {
              std::vector<int,_std::allocator<int>_>::push_back
                        (local_b8,(value_type *)((long)piVar15 + lVar21));
              std::vector<double,_std::allocator<double>_>::push_back
                        (local_68,(value_type_conflict1 *)
                                  ((long)(aq->packValue).
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start + lVar18));
            }
            lVar21 = lVar21 + 4;
            lVar18 = lVar18 + 8;
          }
          local_c0 = (double)CONCAT44(local_c0._4_4_,
                                      (int)((ulong)((long)(local_d0->Uindex).
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(local_d0->Uindex).
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2));
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_a0,(int *)&local_c0);
          iVar10 = (pHVar20->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1];
          iVar9 = (pHVar20->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
          pvVar17 = (vector<int,_std::allocator<int>_> *)(long)iVar9;
          iVar9 = (iVar9 - iVar10) + 1;
          pHVar20->UtotalX = pHVar20->UtotalX + iVar9;
          pHVar20->FtotalX = pHVar20->FtotalX + iVar9;
          local_a8 = pvVar17;
          for (pvVar16 = (vector<int,_std::allocator<int>_> *)(long)iVar10; lVar18 = local_c8,
              (long)pvVar16 < (long)pvVar17;
              pvVar16 = (vector<int,_std::allocator<int>_> *)
                        ((long)&(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + 1)) {
            iVar10 = (pHVar20->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [(pHVar20->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)pvVar16]];
            piVar15 = (pHVar20->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar9 = piVar15[iVar10];
            piVar11 = (pHVar20->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar12 = (pHVar20->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (iVar9 == 0) {
              iVar9 = (pHVar20->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar10];
              local_a0 = (vector<int,_std::allocator<int>_> *)(long)iVar9;
              iVar13 = piVar11[iVar10];
              iVar9 = iVar13 - iVar9;
              local_98 = (pointer)CONCAT44(local_98._4_4_,iVar9);
              iVar9 = (int)((double)iVar9 * 1.1 + 5.0);
              iVar6 = (int)((ulong)((long)(pHVar20->URindex).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar12) >> 2);
              __new_size = (size_type)(iVar6 + iVar9);
              local_b8 = pvVar16;
              std::vector<int,_std::allocator<int>_>::resize(local_b0,__new_size);
              std::vector<double,_std::allocator<double>_>::resize(local_90,__new_size);
              pvVar16 = local_a0;
              lVar18 = (long)iVar6;
              sVar14 = (long)iVar13 * 4 + (long)local_a0 * -4;
              if (sVar14 != 0) {
                piVar15 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                local_38 = lVar18;
                memmove(piVar15 + lVar18,piVar15 + (long)local_a0,sVar14);
                lVar18 = local_38;
              }
              sVar14 = (long)iVar13 * 8 + (long)pvVar16 * -8;
              if (sVar14 != 0) {
                pdVar5 = (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                memmove(pdVar5 + lVar18,pdVar5 + (long)pvVar16,sVar14);
              }
              (local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar10] = iVar6;
              piVar11 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              piVar11[iVar10] = iVar6 + (int)local_98;
              iVar9 = iVar9 - (int)local_98;
              piVar15 = (local_88->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              piVar15[iVar10] = iVar9;
              piVar12 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pvVar16 = local_b8;
              pvVar17 = local_a8;
              pHVar20 = local_d0;
            }
            piVar15[iVar10] = iVar9 + -1;
            iVar9 = piVar11[iVar10];
            piVar11[iVar10] = iVar9 + 1;
            piVar12[iVar9] = iRow;
            (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar9] =
                 (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[(long)pvVar16];
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    (local_80,(pHVar20->URstart).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start + local_c8);
          std::vector<int,_std::allocator<int>_>::push_back
                    (local_78,(pHVar20->URstart).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar18);
          local_c0 = (double)CONCAT44(local_c0._4_4_,
                                      ((pHVar20->URlastp).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[lVar18] +
                                      (pHVar20->URspace).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[lVar18]) -
                                      (pHVar20->URstart).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[lVar18]);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_88,(int *)&local_c0);
          (pHVar20->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[local_58] =
               (int)((ulong)((long)(pHVar20->UpivotIndex).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(pHVar20->UpivotIndex).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
          std::vector<int,_std::allocator<int>_>::push_back(local_60,&local_d4);
          local_c0 = local_50 * local_70;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_48,&local_c0);
          pHVar8 = local_40;
          lVar18 = 0;
          for (lVar19 = 0; pHVar7 = local_d0, lVar19 < pHVar8->packCount; lVar19 = lVar19 + 1) {
            piVar15 = (pHVar8->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (*(int *)((long)piVar15 + lVar18) != local_d4) {
              std::vector<int,_std::allocator<int>_>::push_back
                        (&pHVar20->PFindex,(value_type *)((long)piVar15 + lVar18));
              local_c0 = -*(double *)
                           ((long)(pHVar8->packValue).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar18 * 2) * local_70;
              std::vector<double,_std::allocator<double>_>::emplace_back<double>
                        (&pHVar20->PFvalue,&local_c0);
            }
            lVar18 = lVar18 + 4;
          }
          pvVar16 = &local_d0->PFstart;
          piVar15 = (local_d0->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          iVar10 = (int)((ulong)((long)(local_d0->PFindex).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(local_d0->PFindex).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2);
          local_d0->UtotalX = (local_d0->UtotalX - piVar15[-1]) + iVar10;
          local_d0->FtotalX = (iVar10 - piVar15[-1]) + local_d0->FtotalX + 1;
          std::vector<int,_std::allocator<int>_>::push_back(&local_d0->PFpivotIndex,&local_d4);
          local_c0 = (double)CONCAT44(local_c0._4_4_,
                                      (int)((ulong)((long)(pHVar7->PFindex).
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pHVar7->PFindex).
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2));
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar16,(int *)&local_c0);
          iVar10 = ((pHVar7->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_c8] -
                   (pHVar7->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[local_c8]) + pHVar7->UtotalX;
          pHVar7->UtotalX = iVar10;
          pHVar7->UtotalX =
               (iVar10 - (pHVar7->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[local_c8]) +
               (pHVar7->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[local_c8];
          return;
        }
        iVar10 = piVar15[piVar12[lVar18]];
        iVar9 = local_98[iVar10];
        lVar19 = (long)iVar9;
        iVar13 = piVar11[iVar10];
        lVar21 = (long)iVar13;
        piVar11[iVar10] = iVar13 + -1;
        if (iVar13 < iVar9) {
          iVar13 = iVar9;
        }
        for (; lVar19 < lVar21; lVar19 = lVar19 + 1) {
          if ((local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar19] == iRow) {
            iVar13 = (int)lVar19;
            break;
          }
        }
        piVar1 = piVar2 + iVar10;
        *piVar1 = *piVar1 + 1;
        piVar4[iVar13] = piVar4[lVar21 + -1];
        pdVar5[iVar13] = pdVar5[lVar21 + -1];
        lVar18 = lVar18 + 1;
      } while( true );
    }
    iVar10 = piVar15[piVar12[lVar18]];
    iVar9 = piVar2[iVar10];
    lVar19 = (long)iVar9;
    iVar13 = piVar3[iVar10];
    lVar21 = (long)iVar13;
    piVar3[iVar10] = iVar13 + -1;
    if (iVar13 < iVar9) {
      iVar13 = iVar9;
    }
    for (; lVar19 < lVar21; lVar19 = lVar19 + 1) {
      if ((local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[lVar19] == iRow) {
        iVar13 = (int)lVar19;
        break;
      }
    }
    piVar4[iVar13] = piVar4[lVar21 + -1];
    pdVar5[iVar13] = pdVar5[lVar21 + -1];
    lVar18 = lVar18 + 1;
  } while( true );
}

Assistant:

void HFactor::updateFT(HVector *aq, HVector *ep, int iRow, int *hint) {
    // Store pivot
    int pLogic = UpivotLookup[iRow];
    double pivot = UpivotValue[pLogic];
    double alpha = aq->array[iRow];
    UpivotIndex[pLogic] = -1;

    // Delete pivotal row from U
    FtotalX -= URlastp[pLogic] - URstart[pLogic];
    for (int k = URstart[pLogic]; k < URlastp[pLogic]; k++) {
        // Find the pivotal position
        int iLogic = UpivotLookup[URindex[k]];
        int iFind = Ustart[iLogic];
        int iLast = --Ulastp[iLogic];
        for (; iFind <= iLast; iFind++)
            if (Uindex[iFind] == iRow)
                break;
        // Put last to find, and delete last
        Uindex[iFind] = Uindex[iLast];
        Uvalue[iFind] = Uvalue[iLast];
    }

    // Delete pivotal column from UR
    FtotalX -= Ulastp[pLogic] - Ustart[pLogic];
    for (int k = Ustart[pLogic]; k < Ulastp[pLogic]; k++) {
        // Find the pivotal position
        int iLogic = UpivotLookup[Uindex[k]];
        int iFind = URstart[iLogic];
        int iLast = --URlastp[iLogic];
        for (; iFind <= iLast; iFind++)
            if (URindex[iFind] == iRow)
                break;
        // Put last to find, and delete last
        URspace[iLogic]++;
        URindex[iFind] = URindex[iLast];
        URvalue[iFind] = URvalue[iLast];
    }

    // Store column to U
    Ustart.push_back(Uindex.size());
    for (int i = 0; i < aq->packCount; i++)
        if (aq->packIndex[i] != iRow) {
            Uindex.push_back(aq->packIndex[i]);
            Uvalue.push_back(aq->packValue[i]);
        }
    Ulastp.push_back(Uindex.size());
    int UstartX = Ustart.back();
    int UendX = Ulastp.back();
    UtotalX += UendX - UstartX + 1;
    FtotalX += UendX - UstartX + 1;

    // Store column as UR elements
    for (int k = UstartX; k < UendX; k++) {
        // Which ETA file
        int iLogic = UpivotLookup[Uindex[k]];

        // Move row to the end if necessary
        if (URspace[iLogic] == 0) {
            // Make pointers
            int row_start = URstart[iLogic];
            int row_count = URlastp[iLogic] - row_start;
            int new_start = URindex.size();
            int new_space = row_count * 1.1 + 5;

            // Check matrix UR
            URindex.resize(new_start + new_space);
            URvalue.resize(new_start + new_space);

            // Move elements
            int iFrom = row_start;
            int iEnd = row_start + row_count;
            int iTo = new_start;
            copy(&URindex[iFrom], &URindex[iEnd], &URindex[iTo]);
            copy(&URvalue[iFrom], &URvalue[iEnd], &URvalue[iTo]);

            // Save new pointers
            URstart[iLogic] = new_start;
            URlastp[iLogic] = new_start + row_count;
            URspace[iLogic] = new_space - row_count;
        }

        // Put into the next available space
        URspace[iLogic]--;
        int iPut = URlastp[iLogic]++;
        URindex[iPut] = iRow;
        URvalue[iPut] = Uvalue[k];
    }

    // Store UR pointers
    URstart.push_back(URstart[pLogic]);
    URlastp.push_back(URstart[pLogic]);
    URspace.push_back(URspace[pLogic] + URlastp[pLogic] - URstart[pLogic]);

    // Update pivot count
    UpivotLookup[iRow] = UpivotIndex.size();
    UpivotIndex.push_back(iRow);
    UpivotValue.push_back(pivot * alpha);

    // Store row_ep as R matrix
    for (int i = 0; i < ep->packCount; i++) {
        if (ep->packIndex[i] != iRow) {
            PFindex.push_back(ep->packIndex[i]);
            PFvalue.push_back(-ep->packValue[i] * pivot);
        }
    }
    UtotalX += PFindex.size() - PFstart.back();
    FtotalX += PFindex.size() - PFstart.back() + 1;

    // Store R matrix pivot
    PFpivotIndex.push_back(iRow);
    PFstart.push_back(PFindex.size());

    // Update total countX
    UtotalX -= Ulastp[pLogic] - Ustart[pLogic];
    UtotalX -= URlastp[pLogic] - URstart[pLogic];

//    // See if we want refactor
//    if (UtotalX > UmeritX && PFpivotIndex.size() > 100)
//        *hint = 1;
}